

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void update_history(char *flname)

{
  byte *pbVar1;
  Fl_Menu_Item *pFVar2;
  uint uVar3;
  int iVar4;
  char (*text) [2048];
  long lVar5;
  ulong uVar6;
  char (*__s2) [2048];
  ulong uVar7;
  bool bVar8;
  int max_files;
  char absolute [2048];
  uint local_844;
  Name local_840;
  char local_838 [2056];
  
  Fl_Preferences::get(&fluid_prefs,"recent_files",(int *)&local_844,5);
  if (10 < (int)local_844) {
    local_844 = 10;
  }
  fl_filename_absolute(local_838,0x800,flname);
  uVar3 = local_844;
  uVar7 = (ulong)local_844;
  if ((int)local_844 < 1) {
    return;
  }
  text = absolute_history;
  iVar4 = strcmp(local_838,absolute_history[0]);
  if (iVar4 == 0) {
    bVar8 = true;
    uVar6 = 0;
  }
  else {
    __s2 = absolute_history;
    uVar6 = 0;
    do {
      __s2 = __s2 + 1;
      if (uVar7 - 1 == uVar6) {
        bVar8 = uVar6 + 1 < uVar7;
        uVar6 = (ulong)uVar3;
        goto LAB_0019b56a;
      }
      iVar4 = strcmp(local_838,*__s2);
      uVar6 = uVar6 + 1;
    } while (iVar4 != 0);
    bVar8 = uVar6 < uVar7;
  }
LAB_0019b56a:
  if ((int)uVar6 == 0) {
    return;
  }
  iVar4 = uVar3 - 1;
  if (bVar8) {
    iVar4 = (int)uVar6;
  }
  memmove(absolute_history + 1,absolute_history,(long)iVar4 << 0xb);
  memmove(relative_history + 1,relative_history,(long)iVar4 << 0xb);
  fl_strlcpy(absolute_history[0],local_838,0x800);
  fl_filename_relative(relative_history[0],0x800,absolute_history[0]);
  if ((int)local_844 < 1) {
    uVar7 = 0;
  }
  else {
    lVar5 = 0;
    uVar7 = 0;
    do {
      Fl_Preferences::Name::Name(&local_840,"file%d",uVar7 & 0xffffffff);
      Fl_Preferences::set(&fluid_prefs,local_840.data_,*text);
      Fl_Preferences::Name::~Name(&local_840);
      if ((*text)[0] == '\0') break;
      if (lVar5 == 0x1f8) {
        history_item[9].flags = 0x80;
      }
      else {
        *(undefined4 *)((long)&history_item->flags + lVar5) = 0;
      }
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x38;
      text = text + 1;
    } while ((long)uVar7 < (long)(int)local_844);
    if (9 < (uint)uVar7) goto LAB_0019b6d5;
  }
  uVar7 = uVar7 & 0xffffffff;
  lVar5 = uVar7 * 0x38 + 0x20;
  do {
    Fl_Preferences::Name::Name(&local_840,"file%d",uVar7 & 0xffffffff);
    Fl_Preferences::set(&fluid_prefs,local_840.data_,"");
    Fl_Preferences::Name::~Name(&local_840);
    pFVar2 = history_item;
    if (uVar7 != 0) {
      pbVar1 = (byte *)((long)&history_item[-1].text + lVar5);
      *pbVar1 = *pbVar1 | 0x80;
    }
    pbVar1 = (byte *)((long)&pFVar2->text + lVar5);
    *pbVar1 = *pbVar1 | 0x10;
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 0x38;
  } while (uVar7 != 10);
LAB_0019b6d5:
  Fl_Preferences::flush(&fluid_prefs);
  return;
}

Assistant:

void update_history(const char *flname) {
  int	i;		// Looping var
  char	absolute[FL_PATH_MAX];
  int	max_files;


  fluid_prefs.get("recent_files", max_files, 5);
  if (max_files > 10) max_files = 10;

  fl_filename_absolute(absolute, sizeof(absolute), flname);

  for (i = 0; i < max_files; i ++)
#if defined(WIN32) || defined(__APPLE__)
    if (!strcasecmp(absolute, absolute_history[i])) break;
#else
    if (!strcmp(absolute, absolute_history[i])) break;
#endif // WIN32 || __APPLE__

  if (i == 0) return;

  if (i >= max_files) i = max_files - 1;

  // Move the other flnames down in the list...
  memmove(absolute_history + 1, absolute_history,
          i * sizeof(absolute_history[0]));
  memmove(relative_history + 1, relative_history,
          i * sizeof(relative_history[0]));

  // Put the new file at the top...
  strlcpy(absolute_history[0], absolute, sizeof(absolute_history[0]));

  fl_filename_relative(relative_history[0], sizeof(relative_history[0]),
                       absolute_history[0]);

  // Update the menu items as needed...
  for (i = 0; i < max_files; i ++) {
    fluid_prefs.set( Fl_Preferences::Name("file%d", i), absolute_history[i]);
    if (absolute_history[i][0]) {
      if (i == 9) history_item[i].flags = FL_MENU_DIVIDER;
      else history_item[i].flags = 0;
    } else break;
  }

  for (; i < 10; i ++) {
    fluid_prefs.set( Fl_Preferences::Name("file%d", i), "");
    if (i) history_item[i-1].flags |= FL_MENU_DIVIDER;
    history_item[i].hide();
  }
  fluid_prefs.flush();
}